

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

void __thiscall WorldShuffler::randomize_items(WorldShuffler *this)

{
  WorldSolver *this_00;
  Json *this_01;
  mapped_type_conflict2 mVar1;
  pointer ppIVar2;
  pointer ppVar3;
  Item *pIVar4;
  pointer ppIVar5;
  bool bVar6;
  WorldNode *start_node;
  WorldNode *end_node;
  size_type sVar7;
  mapped_type_conflict2 *pmVar8;
  reference pvVar9;
  pointer ppIVar10;
  pointer ppIVar11;
  pointer ppVar12;
  initializer_list_t init;
  ItemSource *source;
  _Vector_base<Item_*,_std::allocator<Item_*>_> local_70;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  _Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_> local_48;
  
  place_fixed_items(this);
  init_item_pool(this);
  this_00 = &this->_solver;
  start_node = RandomizerWorld::spawn_node(this->_world);
  end_node = RandomizerWorld::end_node(this->_world);
  World::starting_inventory
            ((vector<Item_*,_std::allocator<Item_*>_> *)&local_70,&this->_world->super_World);
  WorldSolver::setup(this_00,start_node,end_node,
                     (vector<Item_*,_std::allocator<Item_*>_> *)&local_70);
  std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_70);
  do {
    bVar6 = WorldSolver::run_until_blocked(this_00);
    ppIVar2 = (this->_solver)._reachable_item_sources.
              super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppIVar11 = (this->_solver)._reachable_item_sources.
                    super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppIVar11 != ppIVar2; ppIVar11 = ppIVar11 + 1)
    {
      local_70._M_impl.super__Vector_impl_data._M_start = (pointer)*ppIVar11;
      sVar7 = std::
              map<ItemSource_*,_unsigned_short,_std::less<ItemSource_*>,_std::allocator<std::pair<ItemSource_*const,_unsigned_short>_>_>
              ::count(&this->_item_source_spheres,(key_type *)&local_70);
      if (sVar7 == 0) {
        mVar1 = this->_current_sphere;
        pmVar8 = std::
                 map<ItemSource_*,_unsigned_short,_std::less<ItemSource_*>,_std::allocator<std::pair<ItemSource_*const,_unsigned_short>_>_>
                 ::operator[](&this->_item_source_spheres,(key_type *)&local_70);
        *pmVar8 = mVar1;
      }
    }
    ppVar3 = (this->_solver)._scheduled_item_placements.
             super__Vector_base<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar12 = (this->_solver)._scheduled_item_placements.
                   super__Vector_base<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>,_std::allocator<std::pair<Item_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar3;
        ppVar12 = ppVar12 + 1) {
      pIVar4 = ppVar12->first;
      std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::vector
                ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&local_48,&ppVar12->second);
      place_item_randomly(this,pIVar4,
                          (vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&local_48);
      std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base(&local_48);
    }
    open_random_blocked_path(this);
    WorldSolver::update_current_inventory(this_00);
    this->_current_sphere = this->_current_sphere + 1;
  } while (bVar6);
  place_remaining_items(this);
  if (this->_options->_archipelago_world == false) {
    this_01 = &(this->_solver)._debug_log;
    WorldSolver::find_minimal_inventory
              ((vector<Item_*,_std::allocator<Item_*>_> *)&local_70,this_00);
    std::vector<Item_*,_std::allocator<Item_*>_>::_M_move_assign(&this->_minimal_items_to_complete);
    std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&local_70);
    init._M_len = 0;
    init._M_array = (iterator)&local_58;
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::array(init);
    pvVar9 = nlohmann::
             basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this_01,"requiredItems");
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator=(pvVar9,&local_58);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_58);
    ppIVar5 = (this->_minimal_items_to_complete).super__Vector_base<Item_*,_std::allocator<Item_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar10 = (this->_minimal_items_to_complete).
                    super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppIVar10 != ppIVar5; ppIVar10 = ppIVar10 + 1)
    {
      pIVar4 = *ppIVar10;
      pvVar9 = nlohmann::
               basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)this_01,"requiredItems");
      nlohmann::
      basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::emplace_back<std::__cxx11::string_const&>
                ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)pvVar9,&pIVar4->_name);
    }
  }
  return;
}

Assistant:

void WorldShuffler::randomize_items()
{
    this->place_fixed_items();
    this->init_item_pool();

    _solver.setup(_world.spawn_node(), _world.end_node(), _world.starting_inventory());

    bool explored_new_nodes = true;
    while(explored_new_nodes)
    {
        // Run a solver step to reach a "blocked" state where something needs to be placed in order to continue
        explored_new_nodes = _solver.run_until_blocked();

        // Update the table of spheres to have accurate data on when an item source was first considered during
        // generation, which is then used to evaluate prices by "logical distance" to starting point
        for(ItemSource* source : _solver.reachable_item_sources())
            if(!_item_source_spheres.count(source))
                _item_source_spheres[source] = _current_sphere;

        // Place all "scheduled" item placements, which correspond to "itemPlacedWhenCrossing" attributes of WorldPaths
        // solver encountered during last step
        for(auto& [item, item_sources] : _solver.scheduled_item_placements())
            this->place_item_randomly(item, item_sources);

        // Place one or several key items in order to open a blocked path
        this->open_random_blocked_path();

        // Item sources changed, force the solver to update its inventory
        _solver.update_current_inventory();

        _current_sphere += 1;
    }

    // Place the remaining items from the item pool in the remaining sources
    this->place_remaining_items();

    // Analyse items required to complete the seed
    Json& debug_log = _solver.debug_log();
    if(!_options.archipelago_world())
    {
        _minimal_items_to_complete = _solver.find_minimal_inventory();
        debug_log["requiredItems"] = Json::array();
        for(Item* item : _minimal_items_to_complete)
            debug_log["requiredItems"].emplace_back(item->name());
    }
}